

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<capnp::PipelineOp>::dispose(ArrayBuilder<capnp::PipelineOp> *this)

{
  PipelineOp *firstElement;
  RemoveConst<capnp::PipelineOp> *pRVar1;
  PipelineOp *pPVar2;
  PipelineOp *endCopy;
  PipelineOp *posCopy;
  PipelineOp *ptrCopy;
  ArrayBuilder<capnp::PipelineOp> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pPVar2 = this->endPtr;
  if (firstElement != (PipelineOp *)0x0) {
    this->ptr = (PipelineOp *)0x0;
    this->pos = (RemoveConst<capnp::PipelineOp> *)0x0;
    this->endPtr = (PipelineOp *)0x0;
    ArrayDisposer::dispose<capnp::PipelineOp>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 3,
               (long)pPVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }